

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

int setup_global(MIR_context_t ctx,char *name,void *addr,MIR_item_t_conflict def)

{
  MIR_module_t_conflict pMVar1;
  char *ctx_00;
  char *name_00;
  int local_44;
  int redef_p;
  MIR_module_t_conflict saved;
  MIR_item_t_conflict tab_item;
  MIR_item_t_conflict item;
  MIR_item_t_conflict def_local;
  void *addr_local;
  char *name_local;
  MIR_context_t ctx_local;
  
  pMVar1 = ctx->curr_module;
  local_44 = 0;
  ctx->curr_module = &ctx->environment_module;
  item = def;
  def_local = (MIR_item_t_conflict)addr;
  addr_local = name;
  name_local = (char *)ctx;
  tab_item = new_export_import_forward(ctx,name,MIR_import_item,"import",1);
  ctx_00 = name_local;
  name_00 = MIR_item_name((MIR_context_t)name_local,tab_item);
  saved = (MIR_module_t_conflict)
          item_tab_find((MIR_context_t)ctx_00,name_00,(MIR_module_t_conflict)(name_local + 0x50));
  if (((MIR_item_t_conflict)saved == tab_item) ||
     ((MIR_item_t_conflict)saved == (MIR_item_t_conflict)0x0)) {
    HTAB_MIR_item_t_do(*(HTAB_MIR_item_t **)(name_local + 0x48),tab_item,HTAB_INSERT,
                       (MIR_item_t_conflict *)&saved);
    DLIST_MIR_item_t_append((DLIST_MIR_item_t *)(name_local + 0x60),tab_item);
    saved = (MIR_module_t_conflict)tab_item;
  }
  else {
    free(tab_item);
    local_44 = 1;
  }
  *(MIR_item_t_conflict *)&saved->last_temp_item_num = def_local;
  (saved->module_link).next = (MIR_module_t)item;
  *(MIR_module_t_conflict *)(name_local + 0x88) = pMVar1;
  return local_44;
}

Assistant:

static int setup_global (MIR_context_t ctx, const char *name, void *addr, MIR_item_t def) {
  MIR_item_t item, tab_item;
  MIR_module_t saved = curr_module;
  int redef_p = FALSE;

  curr_module = &environment_module;
  /* Use import for proto representation: */
  item = new_export_import_forward (ctx, name, MIR_import_item, "import", TRUE);
  if ((tab_item = item_tab_find (ctx, MIR_item_name (ctx, item), &environment_module)) != item
      && tab_item != NULL) {
    free (item);
    redef_p = TRUE;
  } else {
    HTAB_DO (MIR_item_t, module_item_tab, item, HTAB_INSERT, tab_item);
    DLIST_APPEND (MIR_item_t, environment_module.items, item);
    tab_item = item;
  }
  tab_item->addr = addr;
  tab_item->ref_def = def;
  curr_module = saved;
  return redef_p;
}